

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O0

bool __thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::_flipColors
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,
          RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
          *node)

{
  bool bVar1;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *this_00;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *this_01;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *right;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *left;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node_local;
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this_local;
  
  this_00 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            ::left(node);
  this_01 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            ::right(node);
  if ((this_00 ==
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0) ||
     (this_01 ==
      (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
       *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            ::isRed(node);
    if (((bVar1) ||
        (bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                 ::isRed(this_00), !bVar1)) ||
       (bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                ::isRed(this_01), !bVar1)) {
      bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              ::isRed(node);
      if (((!bVar1) ||
          (bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                   ::isRed(this_00), bVar1)) ||
         (bVar1 = RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                  ::isRed(this_01), bVar1)) {
        this_local._7_1_ = false;
      }
      else {
        RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        ::flipColors(node);
        RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        ::flipColors(this_00);
        RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        ::flipColors(this_01);
        this_local._7_1_ = true;
      }
    }
    else {
      if (node != this->_root) {
        RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        ::flipColors(node);
      }
      RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      ::flipColors(this_00);
      RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
      ::flipColors(this_01);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline
    bool RBTree<Key, Value>::_flipColors(RBTreeNode<TreeElement<Key, Value>> *node){
        auto left = node->left();
        auto right = node->right();
        if (left == nullptr || right == nullptr) {
            return false;
        }
        if (!node->isRed() && left->isRed() && right->isRed()) {
            if (node != _root) {
                node->flipColors();
            }
            left->flipColors();
            right->flipColors();
            return true;
        }
        if (node->isRed() && !left->isRed() && !right->isRed()) {
            node->flipColors();
            left->flipColors();
            right->flipColors();
            return true;
        }
        return false;
    }